

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Samplers::DefaultsTest::testSamplerFloatParameter
          (DefaultsTest *this,GLenum pname,GLfloat expected_value)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  char *pcVar2;
  float fVar3;
  GLfloat value;
  float local_1bc;
  float local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1bc = -1.0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa48))(this->m_sampler_dsa,pname,&local_1bc);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetSamplerParameteriv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x130);
  fVar3 = expected_value - local_1bc;
  local_1b8 = -fVar3;
  if (-fVar3 <= fVar3) {
    local_1b8 = fVar3;
  }
  if (0.015625 < local_1b8) {
    uStack_1b4 = 0x80000000;
    uStack_1b0 = 0x80000000;
    uStack_1ac = 0x80000000;
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"glGetSamplerParameterfv with parameter ");
    pcVar2 = glu::getTextureParameterName(pname);
    std::operator<<((ostream *)this_00,pcVar2);
    std::operator<<((ostream *)this_00," has returned ");
    std::ostream::operator<<(this_00,local_1bc);
    std::operator<<((ostream *)this_00,", however ");
    std::ostream::operator<<(this_00,expected_value);
    std::operator<<((ostream *)this_00," was expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return local_1b8 <= 0.015625;
}

Assistant:

bool DefaultsTest::testSamplerFloatParameter(glw::GLenum pname, glw::GLfloat expected_value)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLfloat value = -1.0;

	gl.getSamplerParameterfv(m_sampler_dsa, pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSamplerParameteriv have failed");

	if (de::abs(expected_value - value) > 0.015625f /* Precision */)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetSamplerParameterfv with parameter "
											<< glu::getTextureParameterName(pname) << " has returned " << value
											<< ", however " << expected_value << " was expected."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}